

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataTemplatedWithinCollectionScatter<duckdb::string_t>
               (Vector *param_1,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *param_5,Vector *param_6,Vector *heap_locations,
               idx_t param_8,UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *param_10)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  byte bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  TemplatedValidityData<unsigned_char> *pTVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  idx_t iVar10;
  long *plVar11;
  data_ptr_t pdVar12;
  SelectionVector *pSVar13;
  idx_t iVar14;
  ulong uVar15;
  _Head_base<0UL,_unsigned_char_*,_false> local_98;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true> local_90;
  unsigned_long local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  data_ptr_t local_68;
  SelectionVector *local_60;
  SelectionVector *local_58;
  idx_t local_50;
  long local_48;
  SelectionVector *local_40;
  unsigned_long local_38;
  
  if (append_count != 0) {
    pSVar13 = list_data->sel;
    pdVar12 = list_data->data;
    local_40 = (source_format->unified).sel;
    pdVar1 = (source_format->unified).data;
    pdVar2 = heap_locations->data;
    iVar14 = 0;
    local_68 = pdVar12;
    local_60 = pSVar13;
    local_58 = append_sel;
    local_50 = append_count;
    do {
      iVar10 = iVar14;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)append_sel->sel_vector[iVar14];
      }
      if (pSVar13->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)pSVar13->sel_vector[iVar10];
      }
      puVar3 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0))
         && (*(long *)(pdVar12 + iVar10 * 0x10 + 8) != 0)) {
        plVar11 = (long *)(pdVar12 + iVar10 * 0x10);
        local_98._M_head_impl = *(uchar **)(pdVar2 + iVar14 * 8);
        local_80 = plVar11[1];
        local_90.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_90.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uVar15 = plVar11[1];
        if (local_98._M_head_impl == (uchar *)0x0) {
          local_38 = local_80;
          make_buffer<duckdb::TemplatedValidityData<unsigned_char>,unsigned_long&>
                    ((duckdb *)&local_78,&local_38);
          p_Var5 = p_Stack_70;
          local_90.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_78;
          this._M_pi = local_90.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
          local_78 = (element_type *)0x0;
          p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_90.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
          }
          if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
          }
          pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true>::operator->
                             (&local_90);
          local_98._M_head_impl =
               (pTVar6->owned_data).
               super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        }
        if (uVar15 != 0) {
          lVar7 = (uVar15 + 7 >> 3) - 1;
          if (lVar7 != 0) {
            lVar8 = 0;
            do {
              local_98._M_head_impl[lVar8] = 0xff;
              lVar8 = lVar8 + 1;
            } while (lVar7 != lVar8);
          }
          local_98._M_head_impl[lVar7] =
               local_98._M_head_impl[lVar7] | -((uVar15 & 7) == 0) | ~(-1 << ((byte)uVar15 & 7));
        }
        local_48 = (plVar11[1] + 7U >> 3) + *(long *)(pdVar2 + iVar14 * 8);
        *(long *)(pdVar2 + iVar14 * 8) = local_48 + plVar11[1] * 4;
        if (plVar11[1] != 0) {
          uVar15 = 0;
          do {
            uVar9 = *plVar11 + uVar15;
            if (local_40->sel_vector != (sel_t *)0x0) {
              uVar9 = (ulong)local_40->sel_vector[uVar9];
            }
            puVar3 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                     validity_mask;
            if ((puVar3 == (unsigned_long *)0x0) ||
               ((puVar3[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) {
              lVar7 = uVar9 * 0x10;
              *(undefined4 *)(local_48 + uVar15 * 4) = *(undefined4 *)(pdVar1 + lVar7);
              if ((ulong)*(uint *)(pdVar1 + lVar7) < 0xd) {
                pdVar12 = pdVar1 + lVar7 + 4;
              }
              else {
                pdVar12 = *(data_ptr_t *)(pdVar1 + lVar7 + 8);
              }
              FastMemcpy(*(void **)(pdVar2 + iVar14 * 8),pdVar12,(ulong)*(uint *)(pdVar1 + lVar7));
              *(ulong *)(pdVar2 + iVar14 * 8) =
                   *(long *)(pdVar2 + iVar14 * 8) + (ulong)*(uint *)(pdVar1 + lVar7);
            }
            else {
              bVar4 = (byte)uVar15 & 7;
              local_98._M_head_impl[uVar15 >> 3] =
                   local_98._M_head_impl[uVar15 >> 3] & (-2 << bVar4 | 0xfeU >> 8 - bVar4);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < (ulong)plVar11[1]);
        }
        append_count = local_50;
        pSVar13 = local_60;
        pdVar12 = local_68;
        append_sel = local_58;
        if (local_90.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          append_count = local_50;
          pSVar13 = local_60;
          pdVar12 = local_68;
          append_sel = local_58;
        }
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != append_count);
  }
  return;
}

Assistant:

static void TupleDataTemplatedWithinCollectionScatter(const Vector &, const TupleDataVectorFormat &source_format,
                                                      const SelectionVector &append_sel, const idx_t append_count,
                                                      const TupleDataLayout &, const Vector &, Vector &heap_locations,
                                                      const idx_t, const UnifiedVectorFormat &list_data,
                                                      const vector<TupleDataScatterFunction> &) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<T>(source_data);
	const auto &source_validity = source_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto child_data_location = target_heap_location;
		target_heap_location += list_length * TupleDataWithinListFixedSize<T>();

		// Store the data and validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_source_idx = source_sel.get_index(list_offset + child_i);
			if (source_validity.RowIsValid(child_source_idx)) {
				TupleDataWithinListValueStore<T>(data[child_source_idx],
				                                 child_data_location + child_i * TupleDataWithinListFixedSize<T>(),
				                                 target_heap_location);
			} else {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}
}